

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::RegistryTest_do_not_merge_families_with_different_labels_Test::
~RegistryTest_do_not_merge_families_with_different_labels_Test
          (RegistryTest_do_not_merge_families_with_different_labels_Test *this)

{
  RegistryTest_do_not_merge_families_with_different_labels_Test *this_local;
  
  ~RegistryTest_do_not_merge_families_with_different_labels_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(RegistryTest, do_not_merge_families_with_different_labels) {
  Registry registry{Registry::InsertBehavior::Merge};

  EXPECT_NO_THROW(BuildCounter()
                      .Name("counter")
                      .Help("Test Counter")
                      .Labels({{"a", "A"}})
                      .Register(registry));

  EXPECT_ANY_THROW(BuildCounter()
                       .Name("counter")
                       .Help("Test Counter")
                       .Labels({{"b", "B"}})
                       .Register(registry));
}